

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_net.cpp
# Opt level: O0

void SendSetup(DWORD *playersdetected,BYTE *gotsetup,int len)

{
  int local_20;
  int i;
  int len_local;
  BYTE *gotsetup_local;
  DWORD *playersdetected_local;
  
  if (consoleplayer == Net_Arbitrator) {
    for (local_20 = 1; local_20 < doomcom.numnodes; local_20 = local_20 + 1) {
      if ((gotsetup[local_20] == '\0') || (doomcom.data[0] == '#')) {
        HSendPacket(local_20,len);
      }
    }
  }
  else if ((playersdetected[1] & 1 << ((byte)consoleplayer & 0x1f)) == 0) {
    HSendPacket(1,len);
  }
  else {
    HSendPacket(1,10);
  }
  return;
}

Assistant:

static void SendSetup (DWORD playersdetected[MAXNETNODES], BYTE gotsetup[MAXNETNODES], int len)
{
	if (consoleplayer != Net_Arbitrator)
	{
		if (playersdetected[1] & (1 << consoleplayer))
		{
			HSendPacket (1, 10);
		}
		else
		{
			HSendPacket (1, len);
		}
	}
	else
	{
		for (int i = 1; i < doomcom.numnodes; ++i)
		{
			if (!gotsetup[i] || netbuffer[0] == NCMD_SETUP+3)
			{
				HSendPacket (i, len);
			}
		}
	}
}